

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMisc.c
# Opt level: O2

void Extra_BitMatrixShow(Vec_Wrd_t *vSims,int nWords)

{
  uint uVar1;
  uint uVar2;
  word *Sign;
  int iVar3;
  int iVar4;
  FILE *pFVar5;
  FILE *pFile;
  int i;
  int iVar6;
  
  uVar1 = vSims->nSize / nWords;
  iVar3 = 0;
  if (0 < nWords) {
    iVar3 = nWords;
  }
  if ((int)uVar1 < 1) {
    uVar1 = 0;
  }
  iVar6 = 0;
  pFVar5 = (FILE *)vSims;
  for (uVar2 = 0; uVar2 != uVar1; uVar2 = uVar2 + 1) {
    i = iVar6;
    iVar4 = iVar3;
    if ((uVar2 & 0x3f) == 0) {
      Abc_Print((int)pFVar5,"\n");
    }
    while (pFile = _stdout, iVar4 != 0) {
      Sign = Vec_WrdEntryP(vSims,i);
      Extra_PrintBinary2(pFile,(uint *)Sign,0x40);
      Abc_Print((int)pFile," ");
      pFVar5 = pFile;
      i = i + 1;
      iVar4 = iVar4 + -1;
    }
    Abc_Print((int)pFVar5,"\n");
    iVar6 = iVar6 + nWords;
  }
  Abc_Print((int)pFVar5,"\n");
  return;
}

Assistant:

void Extra_BitMatrixShow( Vec_Wrd_t * vSims, int nWords )
{
    int i, k, nBits = Vec_WrdSize(vSims)  / nWords;
    for ( i = 0; i < nBits; i++ )
    {
        if ( i%64 == 0 )
            Abc_Print( 1, "\n" );
        for ( k = 0; k < nWords; k++ )
        {
            Extra_PrintBinary2( stdout, (unsigned *)Vec_WrdEntryP(vSims, i*nWords+k), 64 );
            Abc_Print( 1, " " );
        }
        Abc_Print( 1, "\n" );
    }
    Abc_Print( 1, "\n" );
}